

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void stbi__copyval(int channel,stbi_uc *dest,stbi_uc *src)

{
  int mask;
  int i;
  long lVar1;
  
  mask = 0x80;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    if ((mask & channel) != 0) {
      dest[lVar1] = src[lVar1];
    }
    mask = (uint)mask >> 1;
  }
  return;
}

Assistant:

static void stbi__copyval(int channel, stbi_uc *dest, const stbi_uc *src) {
  int mask = 0x80, i;

  for (i = 0; i < 4; ++i, mask >>= 1)
    if (channel & mask)
      dest[i] = src[i];
}